

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  uchar *data_00;
  int local_5c;
  float *hdr_data;
  uchar *data;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    data_00 = stbi__load_flip(s,x,y,comp,req_comp);
    if (data_00 == (uchar *)0x0) {
      stbi__err("unknown image type");
      s_local = (stbi__context *)0x0;
    }
    else {
      local_5c = req_comp;
      if (req_comp == 0) {
        local_5c = *comp;
      }
      s_local = (stbi__context *)stbi__ldr_to_hdr(data_00,*x,*y,local_5c);
    }
  }
  else {
    s_local = (stbi__context *)stbi__hdr_load(s,x,y,comp,req_comp);
    if (s_local != (stbi__context *)0x0) {
      stbi__float_postprocess((float *)s_local,x,y,comp,req_comp);
    }
  }
  return (float *)s_local;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_flip(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}